

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void CTcPrsOpUnary::capture_embedded(CTcEmbedBuilder *b,CTcEmbedTokenList *tl)

{
  tc_toktyp_t tVar1;
  tc_toktyp_t tVar2;
  int iVar3;
  
  tl->wrt = tl->head;
  tl->cnt = 0;
  iVar3 = 0;
  do {
    tVar1 = (G_tok->curtok_).typ_;
    if ((1 < tVar1 - TOKT_LPAR) && (1 < tVar1 - TOKT_LBRACK)) {
      if (tVar1 == TOKT_LBRACE) {
        iVar3 = iVar3 + 1;
      }
      else if (tVar1 == TOKT_RBRACE) {
        if (iVar3 < 1) {
          return;
        }
        iVar3 = iVar3 + -1;
      }
      else if (tVar1 == TOKT_SEM) {
        if (iVar3 == 0) {
          return;
        }
      }
      else {
        if (tVar1 == TOKT_EOF) {
          return;
        }
        tVar2 = (*b->_vptr_CTcEmbedBuilder[7])(b);
        if (tVar1 == tVar2) {
          return;
        }
        tVar1 = (G_tok->curtok_).typ_;
        tVar2 = (*b->_vptr_CTcEmbedBuilder[6])(b);
        if (tVar1 == tVar2) {
          return;
        }
      }
    }
    CTcEmbedTokenList::add_tok(tl,&G_tok->curtok_);
    CTcTokenizer::next(G_tok);
  } while( true );
}

Assistant:

void CTcPrsOpUnary::capture_embedded(CTcEmbedBuilder *b, CTcEmbedTokenList *tl)
{
    /* reset the list */
    tl->reset();

    /* we don't have any nested braces or parens yet */
    int braces = 0, parens = 0, bracks = 0;

    /* run through the list */
    for (;;)
    {
        /* check what we have */
        switch (G_tok->cur())
        {
        case TOKT_LBRACE:
            ++braces;
            break;
            
        case TOKT_RBRACE:
            /* 
             *   if we find an unbalanced close brace, assume that we've
             *   reached the end of the statement without properly
             *   terminating the string 
             */
            if (--braces < 0)
                return;
            break;
            
        case TOKT_LPAR:
            ++parens;
            break;
            
        case TOKT_RPAR:
            --parens;
            break;
            
        case TOKT_LBRACK:
            ++bracks;
            break;
            
        case TOKT_RBRACK:
            --bracks;
            break;
            
        case TOKT_SEM:
            /* 
             *   if we find a semicolon outside of braces, assume that we've
             *   reached the end of the statement without properly
             *   terminating the string 
             */
            if (braces == 0)
                return;
            break;
            
        case TOKT_EOF:
            return;
            
        default:
            /* stop if we've reached the next string segment */
            if (G_tok->cur() == b->end_tok()
                || G_tok->cur() == b->mid_tok())
                return;
            break;
        }
        
        /* add the token to the capture list and move on to the next */
        tl->add_tok(G_tok->getcur());
        G_tok->next();
    }
}